

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

ostream * Json::operator<<(ostream *sout,Value *root)

{
  size_t in_RCX;
  StyledStreamWriter writer;
  string local_b0;
  StyledStreamWriter local_90;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\t","");
  StyledStreamWriter::StyledStreamWriter(&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  StyledStreamWriter::write(&local_90,(int)sout,root,in_RCX);
  StyledStreamWriter::~StyledStreamWriter(&local_90);
  return sout;
}

Assistant:

std::ostream& operator<<(std::ostream& sout, const Value& root) {
  Json::StyledStreamWriter writer;
  writer.write(sout, root);
  return sout;
}